

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<int,_32UL>::UnorderedArrayList
          (UnorderedArrayList<int,_32UL> *this,SlabAllocator *alloc)

{
  int *piVar1;
  int *newBlockData;
  SlabAllocator *alloc_local;
  UnorderedArrayList<int,_32UL> *this_local;
  
  this->m_alloc = alloc;
  piVar1 = SlabAllocatorBase<0>::SlabAllocateFixedSizeArray<int,32ul>(this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = piVar1;
  (this->m_inlineHeadBlock).CurrPos = piVar1;
  (this->m_inlineHeadBlock).EndPos = piVar1 + 0x20;
  (this->m_inlineHeadBlock).Next = (UnorderedArrayListLink *)0x0;
  return;
}

Assistant:

UnorderedArrayList(SlabAllocator* alloc)
            : m_alloc(alloc)
        {
            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = nullptr;
        }